

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multiplicities.test.cpp
# Opt level: O3

string * chunkWithMultiplePartials_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)in_RDI,
             " 0.000000+0 0.000000+0          0          0          1          2922812 18     \n          2          2                                            922812 18     \n 1.000000-5 1.000000+1 3.000000+7 1.500000+1                      922812 18     \n 0.000000+0 0.000000+0          0          1          1          2922812 18     \n          2          2                                            922812 18     \n 1.000000-5 8.579050+0 3.000000+7 1.487778+1                      922812 18     \n 0.000000+0 0.000000+0          0          1          1          2922812 18     \n          2          2                                            922812 18     \n 1.000000-5 1.420950+0 3.000000+7 1.222200-1                      922812 18     \n"
             ,"");
  return in_RDI;
}

Assistant:

std::string chunkWithMultiplePartials() {
  return
  " 0.000000+0 0.000000+0          0          0          1          2922812 18     \n"
  "          2          2                                            922812 18     \n"
  " 1.000000-5 1.000000+1 3.000000+7 1.500000+1                      922812 18     \n"
  " 0.000000+0 0.000000+0          0          1          1          2922812 18     \n"
  "          2          2                                            922812 18     \n"
  " 1.000000-5 8.579050+0 3.000000+7 1.487778+1                      922812 18     \n"
  " 0.000000+0 0.000000+0          0          1          1          2922812 18     \n"
  "          2          2                                            922812 18     \n"
  " 1.000000-5 1.420950+0 3.000000+7 1.222200-1                      922812 18     \n";
}